

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_set<int>
          (App *this,string *name,int *member,
          set<int,_std::less<int>,_std::allocator<int>_> *options,string *description)

{
  reference pvVar1;
  Option *pOVar2;
  char *pcVar3;
  string *description_00;
  string local_228;
  allocator local_201;
  undefined1 local_200 [32];
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  allocator local_179;
  string local_178 [8];
  string typeval;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_138;
  string local_118;
  Option *local_f8;
  Option *opt;
  set<int,_std::less<int>,_std::allocator<int>_> local_e8;
  string local_b8 [32];
  undefined1 local_98 [8];
  callback_t fun;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50 [8];
  string simple_name;
  string *description_local;
  set<int,_std::less<int>,_std::allocator<int>_> *options_local;
  int *member_local;
  string *name_local;
  App *this_local;
  
  simple_name.field_2._8_8_ = description;
  detail::split(&local_68,name,',');
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(&local_68,0);
  ::std::__cxx11::string::string(local_50,(string *)pvVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  opt = (Option *)member;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_e8,options);
  ::std::__cxx11::string::string(local_b8,local_50);
  ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
  function<CLI::App::add_set<int>(std::__cxx11::string,int&,std::set<int,std::less<int>,std::allocator<int>>,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
            ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
              *)local_98,(anon_class_88_3_1d669d6f *)&opt);
  add_set<int>(std::__cxx11::string,int&,std::set<int,std::less<int>,std::allocator<int>>,std::__cxx11::string)
  ::{lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)#1}::~vector
            ((_lambda_std__vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>__1_ *)
             &opt);
  ::std::__cxx11::string::string((string *)&local_118,(string *)name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_138,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)local_98);
  ::std::__cxx11::string::string((string *)(typeval.field_2._M_local_buf + 8),(string *)description)
  ;
  description_00 = (string *)((long)&typeval.field_2 + 8);
  pOVar2 = add_option(this,&local_118,&local_138,description_00,false);
  ::std::__cxx11::string::~string((string *)(typeval.field_2._M_local_buf + 8));
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function(&local_138);
  ::std::__cxx11::string::~string((string *)&local_118);
  local_f8 = pOVar2;
  pcVar3 = detail::type_name<int,_(CLI::detail::enabler)0>();
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_178,pcVar3,&local_179);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_179);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_200,",",&local_201);
  detail::join<std::set<int,std::less<int>,std::allocator<int>>>
            ((string *)(local_200 + 0x20),(detail *)options,
             (set<int,_std::less<int>,_std::allocator<int>_> *)local_200,description_00);
  ::std::operator+(&local_1c0," in {",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_200 + 0x20));
  ::std::operator+(&local_1a0,&local_1c0,"}");
  ::std::__cxx11::string::operator+=(local_178,(string *)&local_1a0);
  ::std::__cxx11::string::~string((string *)&local_1a0);
  ::std::__cxx11::string::~string((string *)&local_1c0);
  ::std::__cxx11::string::~string((string *)(local_200 + 0x20));
  ::std::__cxx11::string::~string((string *)local_200);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_201);
  pOVar2 = local_f8;
  ::std::__cxx11::string::string((string *)&local_228,local_178);
  Option::set_custom_option(pOVar2,&local_228,1);
  ::std::__cxx11::string::~string((string *)&local_228);
  pOVar2 = local_f8;
  ::std::__cxx11::string::~string(local_178);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::~function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
               *)local_98);
  ::std::__cxx11::string::~string(local_50);
  return pOVar2;
}

Assistant:

Option *add_set(std::string name,
                    T &member,           ///< The selected member of the set
                    std::set<T> options, ///< The set of possibilities
                    std::string description = "") {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&member, options, simple_name](CLI::results_t res) {
            bool retval = detail::lexical_cast(res[0], member);
            if(!retval)
                throw ConversionError(res[0], simple_name);
            return std::find(std::begin(options), std::end(options), member) != std::end(options);
        };

        Option *opt = add_option(name, fun, description, false);
        std::string typeval = detail::type_name<T>();
        typeval += " in {" + detail::join(options) + "}";
        opt->set_custom_option(typeval);
        return opt;
    }